

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_layer(InstanceBuilder *this,char *layer_name)

{
  pointer *pppcVar1;
  iterator __position;
  char *local_10;
  
  if (layer_name != (char *)0x0) {
    __position._M_current =
         (this->info).layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->info).layers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_10 = layer_name;
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                ((vector<char_const*,std::allocator<char_const*>> *)&(this->info).layers,__position,
                 &local_10);
    }
    else {
      *__position._M_current = layer_name;
      pppcVar1 = &(this->info).layers.
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_layer(const char* layer_name) {
    if (!layer_name) return *this;
    info.layers.push_back(layer_name);
    return *this;
}